

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O3

void __thiscall ArgParser::displayInfo(ArgParser *this)

{
  FILE *__stream;
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  pointer pAVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  fprintf(_stderr,"%s\nAvailable options:\n",(this->m_preInfo)._M_dataplus._M_p);
  pAVar4 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar4) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      uVar2 = (ulong)*(uint *)((long)&pAVar4->argType + lVar7);
      if (uVar2 < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_b0,0,(char *)0x0,
                   (ulong)(&DAT_0010ca28 + *(int *)(&DAT_0010ca28 + uVar2 * 4)));
      }
      __stream = _stderr;
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_args).
                               super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                               super__Vector_impl_data._M_start)->shortName)._M_dataplus + lVar7),
                     &local_b0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_90 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_90 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
      }
      plVar1 = local_90;
      local_88 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->m_args).
                               super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                               super__Vector_impl_data._M_start)->name)._M_dataplus + lVar7),
                     &local_b0);
      fprintf(__stream,"  %-15s  %-25s\t:  %s\n",plVar1,local_50._M_dataplus._M_p,
              *(undefined8 *)
               ((long)&(((this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>.
                         _M_impl.super__Vector_impl_data._M_start)->description)._M_dataplus + lVar7
               ));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      uVar6 = uVar6 + 1;
      pAVar4 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0xe0;
    } while (uVar6 < (ulong)(((long)(this->m_args).
                                    super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) / 0xe0
                            ));
  }
  fprintf(_stderr,"%s\n",(this->m_postInfo)._M_dataplus._M_p);
  return;
}

Assistant:

void ArgParser::displayInfo()
{
    fprintf(stderr, "%s\nAvailable options:\n", m_preInfo.c_str());
    for (size_t i=0; i<m_args.size(); i++)
    {
        std::string type;
        switch (m_args[i].argType)
        {
        case ARG_UINT:
            type = " <int>";
            break;
        case ARG_FLOAT:
            type = " <float>";
            break;
        case ARG_STRING:
            type = " <string>";
            break;
        case ARG_FLAG:
        case ARG_NONE:
            type = "";
            break;
        }
        fprintf(stderr, "  %-15s  %-25s\t:  %s\n",
                (m_args[i].shortName + type + ",").c_str(),
                (m_args[i].name + type).c_str(),
                m_args[i].description.c_str());
    }
    fprintf(stderr, "%s\n", m_postInfo.c_str());
}